

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O1

char * read_file(char *filename)

{
  int iVar1;
  FILE *__stream;
  size_t __n;
  char *__ptr;
  size_t sVar2;
  
  __stream = fopen(filename,"rb");
  if (__stream != (FILE *)0x0) {
    __ptr = (char *)0x0;
    iVar1 = fseek(__stream,0,2);
    if (iVar1 != 0) goto LAB_00105a78;
    __n = ftell(__stream);
    if (-1 < (long)__n) {
      __ptr = (char *)0x0;
      iVar1 = fseek(__stream,0,0);
      if (iVar1 != 0) goto LAB_00105a78;
      __ptr = (char *)malloc(__n + 1);
      if (__ptr != (char *)0x0) {
        sVar2 = fread(__ptr,1,__n,__stream);
        if (sVar2 == __n) {
          __ptr[sVar2] = '\0';
          goto LAB_00105a78;
        }
        free(__ptr);
      }
    }
  }
  __ptr = (char *)0x0;
LAB_00105a78:
  if (__stream != (FILE *)0x0) {
    fclose(__stream);
  }
  return __ptr;
}

Assistant:

char* read_file(const char *filename) {
    FILE *file = NULL;
    long length = 0;
    char *content = NULL;
    size_t read_chars = 0;

    /* open in read binary mode */
    file = fopen(filename, "rb");
    if (file == NULL)
    {
        goto cleanup;
    }

    /* get the length */
    if (fseek(file, 0, SEEK_END) != 0)
    {
        goto cleanup;
    }
    length = ftell(file);
    if (length < 0)
    {
        goto cleanup;
    }
    if (fseek(file, 0, SEEK_SET) != 0)
    {
        goto cleanup;
    }

    /* allocate content buffer */
    content = (char*)malloc((size_t)length + sizeof(""));
    if (content == NULL)
    {
        goto cleanup;
    }

    /* read the file into memory */
    read_chars = fread(content, sizeof(char), (size_t)length, file);
    if ((long)read_chars != length)
    {
        free(content);
        content = NULL;
        goto cleanup;
    }
    content[read_chars] = '\0';


cleanup:
    if (file != NULL)
    {
        fclose(file);
    }

    return content;
}